

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

int Super_CompareGates(Super_Man_t *pMan,uint *uTruth,float Area,float *tPinDelaysRes,int nPins)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char **ppcVar11;
  int *piVar12;
  ulong uVar13;
  char *pEntry;
  double dVar14;
  Super_Gate_t_conflict **ppList;
  char *local_58;
  char **local_50;
  int *local_48;
  double local_40;
  double local_38;
  
  uVar3 = *uTruth;
  if (pMan->nVarsMax < 6) {
    if (1 < uVar3 + 1) goto LAB_00378b5f;
  }
  else if (uVar3 == 0xffffffff) {
    if (uTruth[1] != 0xffffffff) goto LAB_00378b5f;
  }
  else if ((uVar3 != 0) || (uTruth[1] != 0)) {
LAB_00378b5f:
    iVar9 = stmm_find(pMan->tTable,(char *)(ulong)(uTruth[1] ^ *uTruth),&local_50);
    if (iVar9 == 0) {
      return 1;
    }
    pEntry = *local_50;
    if (pEntry == (char *)0x0) {
      return 1;
    }
    dVar14 = (double)Area;
    local_38 = dVar14 + 0.001;
    local_48 = &pMan->nRemoved;
    local_58 = (char *)0x0;
    pcVar8 = *(char **)(pEntry + 0x68);
    local_40 = dVar14;
    do {
      pcVar10 = pcVar8;
      pMan->nLookups = pMan->nLookups + 1;
      piVar12 = &pMan->nAliases;
      if ((*(uint *)(pEntry + 0xc) == *uTruth) && (*(uint *)(pEntry + 0x10) == uTruth[1])) {
        if (dVar14 <= (double)*(float *)(pEntry + 0x48) + 0.001) {
          bVar4 = false;
          if ((double)*(float *)(pEntry + 0x48) <= local_38) goto LAB_00378c5c;
          bVar6 = true;
        }
        else {
          bVar4 = true;
LAB_00378c5c:
          bVar6 = false;
        }
        bVar5 = bVar4;
        bVar7 = bVar6;
        if (0 < nPins) {
          uVar13 = 0;
          do {
            fVar1 = *(float *)(pEntry + uVar13 * 4 + 0x4c);
            if ((fVar1 != -9999.0) || (NAN(fVar1))) {
              fVar2 = tPinDelaysRes[uVar13];
              if ((fVar2 != -9999.0) || (NAN(fVar2))) {
                if (fVar2 <= fVar1 + 0.001) {
                  if (fVar2 + 0.001 < fVar1) {
                    bVar6 = true;
                  }
                }
                else {
                  bVar4 = true;
                }
                bVar5 = true;
                bVar7 = true;
                if (bVar4 && bVar6) break;
              }
            }
            uVar13 = uVar13 + 1;
            bVar5 = bVar4;
            bVar7 = bVar6;
          } while ((uint)nPins != uVar13);
        }
        if (!bVar5 || !bVar7) {
          if (!bVar7) {
            return 0;
          }
          ppcVar11 = local_50;
          if (local_58 != (char *)0x0) {
            ppcVar11 = (char **)(local_58 + 0x68);
          }
          *ppcVar11 = *(char **)(pEntry + 0x68);
          Extra_MmFixedEntryRecycle(pMan->pMem,pEntry);
          piVar12 = local_48;
          dVar14 = local_40;
          goto LAB_00378d41;
        }
      }
      else {
LAB_00378d41:
        *piVar12 = *piVar12 + 1;
        pEntry = local_58;
      }
      local_58 = pEntry;
      if (pcVar10 == (char *)0x0) {
        return 1;
      }
      pcVar8 = *(char **)(pcVar10 + 0x68);
      pEntry = pcVar10;
    } while( true );
  }
  return 0;
}

Assistant:

int Super_CompareGates( Super_Man_t * pMan, unsigned uTruth[], float Area, float tPinDelaysRes[], int nPins )
{
    Super_Gate_t ** ppList, * pPrev, * pGate, * pGate2;
    int i, fNewIsBetter, fGateIsBetter;
    ABC_PTRUINT_T Key;

    // skip constant functions
    if ( pMan->nVarsMax < 6 )
    {
        if ( uTruth[0] == 0 || ~uTruth[0] == 0 )
            return 0;
    }
    else
    {
        if ( ( uTruth[0] == 0 && uTruth[1] == 0 ) || ( ~uTruth[0] == 0 && ~uTruth[1] == 0 ) )
            return 0;
    }

    // get hold of the place where the entry is stored
//    Key = uTruth[0] + 2003 * uTruth[1];
    Key = uTruth[0] ^ uTruth[1];
    if ( !stmm_find( pMan->tTable, (char *)Key, (char ***)&ppList ) )
        return 1; 
    // the entry with this truth table is found
    pPrev = NULL;
    for ( pGate = *ppList, pGate2 = pGate? pGate->pNext: NULL; pGate; 
        pGate = pGate2, pGate2 = pGate? pGate->pNext: NULL )
    {
        pMan->nLookups++;
        if ( pGate->uTruth[0] != uTruth[0] || pGate->uTruth[1] != uTruth[1] )
        {
            pMan->nAliases++;
            continue;
        }
        fGateIsBetter = 0;
        fNewIsBetter  = 0;
        if ( pGate->Area + SUPER_EPSILON < Area )
            fGateIsBetter = 1;
        else if ( pGate->Area > Area + SUPER_EPSILON )
            fNewIsBetter = 1;
        for ( i = 0; i < nPins; i++ )
        {
            if ( pGate->ptDelays[i] == SUPER_NO_VAR || tPinDelaysRes[i] == SUPER_NO_VAR )
                continue;
            if ( pGate->ptDelays[i] + SUPER_EPSILON < tPinDelaysRes[i] )
                fGateIsBetter = 1;
            else if ( pGate->ptDelays[i] > tPinDelaysRes[i] + SUPER_EPSILON )
                fNewIsBetter = 1;
            if ( fGateIsBetter && fNewIsBetter )
                break;
        }
        // consider 4 cases
        if ( fGateIsBetter && fNewIsBetter ) // Pareto points; save both
            pPrev = pGate;
        else if ( fNewIsBetter ) // gate is worse; remove the gate
        {
            if ( pPrev == NULL )
                *ppList = pGate->pNext;
            else
                pPrev->pNext = pGate->pNext;
            Extra_MmFixedEntryRecycle( pMan->pMem, (char *)pGate );
            pMan->nRemoved++;
        }
        else if ( fGateIsBetter ) // new is worse, already dominated no need to see others
            return 0;
        else // if ( !fGateIsBetter && !fNewIsBetter ) // they are identical, no need to see others
            return 0;
    }
    return 1;
}